

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

RequiredExtensions *
deqp::gls::TextureStateQueryTests::anon_unknown_1::getTesterExtension
          (RequiredExtensions *__return_storage_ptr__,ContextType *contextType,TesterType tester)

{
  bool bVar1;
  ulong uVar2;
  char *ext;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (bVar1) {
    if (2 < tester - TESTER_TEXTURE_SRGB_DECODE_EXT) goto LAB_018656ee;
  }
  else {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (!bVar1) {
      glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
LAB_018656ee:
      (__return_storage_ptr__->m_extensions).
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->m_extensions).
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->m_extensions).
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    if (TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER < tester) goto LAB_018656ee;
    uVar2 = (ulong)tester;
    if ((0x1e31b6db6db6db6U >> (uVar2 & 0x3f) & 1) != 0) {
      ext = "GL_EXT_texture_border_clamp";
      goto LAB_018656d7;
    }
    if ((0x18000000000000U >> (uVar2 & 0x3f) & 1) != 0) {
      (__return_storage_ptr__->m_extensions).
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->m_extensions).
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->m_extensions).
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      RequiredExtensions::add(__return_storage_ptr__,"GL_EXT_texture_sRGB_decode");
      RequiredExtensions::add(__return_storage_ptr__,"GL_EXT_texture_border_clamp");
      return __return_storage_ptr__;
    }
    if (uVar2 != 0x32) goto LAB_018656ee;
  }
  ext = "GL_EXT_texture_sRGB_decode";
LAB_018656d7:
  RequiredExtensions::RequiredExtensions(__return_storage_ptr__,ext);
  return __return_storage_ptr__;
}

Assistant:

static RequiredExtensions getTesterExtension (const glu::ContextType& contextType, TesterType tester)
{
	DE_ASSERT(!isCoreTester(contextType, tester));

	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::getTesterExtension(tester);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::getTesterExtension(tester);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::getTesterExtension(tester);
	else
	{
		DE_ASSERT(false);
		return RequiredExtensions();
	}
}